

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::parse_value<std::__cxx11::string>
               (string *text,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  byte bVar1;
  istream *piVar2;
  ostream *this;
  long lVar3;
  argument_incorrect_type *paVar4;
  istringstream local_198 [8];
  istringstream is;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *text_local;
  
  std::__cxx11::istringstream::istringstream(local_198,text,8);
  piVar2 = std::operator>>((istream *)local_198,(string *)value);
  bVar1 = std::ios::operator!((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
  if ((bVar1 & 1) != 0) {
    this = std::operator<<((ostream *)&std::cerr,"cannot parse empty value");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    paVar4 = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(paVar4,text);
    __cxa_throw(paVar4,&argument_incorrect_type::typeinfo,
                argument_incorrect_type::~argument_incorrect_type);
  }
  std::__cxx11::istringstream::rdbuf();
  lVar3 = std::streambuf::in_avail();
  if (lVar3 != 0) {
    paVar4 = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(paVar4,text);
    __cxa_throw(paVar4,&argument_incorrect_type::typeinfo,
                argument_incorrect_type::~argument_incorrect_type);
  }
  std::__cxx11::istringstream::~istringstream(local_198);
  return;
}

Assistant:

void
    parse_value(const std::string& text, T& value)
    {
      std::istringstream is(text);
      if (!(is >> value))
      {
        std::cerr << "cannot parse empty value" << std::endl;
        throw argument_incorrect_type(text);
      }

      if (is.rdbuf()->in_avail() != 0)
      {
        throw argument_incorrect_type(text);
      }
    }